

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transacHashMap.h
# Opt level: O0

void __thiscall
myTransacHashMap::myTransacHashMap
          (myTransacHashMap *this,uint tableSize,_func_uint_myString_ptr_uint *hashF,
          uint bucketSizeInBytes)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  ulong *puVar4;
  recordsBucket_chain *prVar5;
  ulong uVar6;
  recordsBucket_chain *local_68;
  uint maxNumberOfRecordsInBucket;
  uint bucketSizeInBytes_local;
  _func_uint_myString_ptr_uint *hashF_local;
  uint tableSize_local;
  myTransacHashMap *this_local;
  
  this->tableSize = tableSize;
  uVar2 = CONCAT44(0,tableSize);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar2;
  uVar3 = SUB168(auVar1 * ZEXT816(0x30),0);
  uVar6 = uVar3 + 8;
  if (SUB168(auVar1 * ZEXT816(0x30),8) != 0 || 0xfffffffffffffff7 < uVar3) {
    uVar6 = 0xffffffffffffffff;
  }
  puVar4 = (ulong *)operator_new__(uVar6);
  *puVar4 = uVar2;
  prVar5 = (recordsBucket_chain *)(puVar4 + 1);
  if (uVar2 != 0) {
    local_68 = prVar5;
    do {
      recordsBucket_chain::recordsBucket_chain(local_68);
      local_68 = local_68 + 1;
    } while (local_68 != prVar5 + uVar2);
  }
  this->table = prVar5;
  recordsBucket_chain::setMaxNumberOfRecordsInBucket(this->table,bucketSizeInBytes >> 6);
  this->hashFunc = hashF;
  return;
}

Assistant:

myTransacHashMap(unsigned tableSize ,unsigned (*hashF)(const myString&, unsigned)  ,unsigned bucketSizeInBytes) {

        this->tableSize = tableSize;

        table = new recordsBucket_chain  [tableSize] ;

        unsigned maxNumberOfRecordsInBucket = bucketSizeInBytes/sizeof(record);

        table->setMaxNumberOfRecordsInBucket(maxNumberOfRecordsInBucket);

        this->hashFunc = hashF;

    }